

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O2

void mandelbrot_calc(ImageSize *image,Section *section,int max_iterations,
                    vector<int,_std::allocator<int>_> *iterations_histogram,
                    vector<CalculationResult,_std::allocator<CalculationResult>_> *results_per_point
                    )

{
  int *piVar1;
  double dVar2;
  double dVar3;
  pointer piVar4;
  pointer pCVar5;
  pointer piVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  float fVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  dVar2 = section->center_x;
  dVar3 = section->center_y;
  dVar17 = ((double)image->width / (double)image->height) * section->height * 0.5;
  dVar13 = section->height * 0.5;
  piVar4 = (iterations_histogram->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar6 = (iterations_histogram->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar6 != piVar4; piVar6 = piVar6 + 1) {
    *piVar6 = 0;
  }
  iVar7 = 0;
  uVar8 = 0;
  if (0 < max_iterations) {
    uVar8 = max_iterations;
  }
  lVar9 = 0;
  do {
    if (image->height <= iVar7) {
      return;
    }
    dVar14 = std::__lerp<double>(dVar13 + dVar3,dVar3 - dVar13,(double)iVar7 / (double)image->height
                                );
    lVar9 = (long)(int)lVar9;
    for (iVar11 = 0; iVar11 < image->width; iVar11 = iVar11 + 1) {
      dVar15 = std::__lerp<double>(dVar2 - dVar17,dVar2 + dVar17,
                                   (double)iVar11 / (double)image->width);
      dVar18 = 0.0;
      uVar10 = 0;
      dVar16 = 0.0;
      while( true ) {
        fVar12 = 0.0;
        if (uVar8 == (uint)uVar10) break;
        dVar20 = dVar18 * dVar18;
        dVar19 = dVar20 + dVar16 * dVar16;
        if (400.0 <= dVar19) {
          fVar12 = 0.0;
          if ((int)(uint)uVar10 < max_iterations) {
            piVar1 = (iterations_histogram->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start + uVar10;
            *piVar1 = *piVar1 + 1;
            dVar16 = log(SQRT(dVar19));
            dVar16 = log(dVar16);
            fVar12 = (float)((dVar16 + -1.0971887003649488) / 0.6931471805599453);
            if (1.0 <= fVar12) {
              fVar12 = 1.0;
            }
            fVar12 = 1.0 - fVar12;
          }
          goto LAB_00104da3;
        }
        dVar18 = (dVar16 + dVar16) * dVar18 + dVar14;
        uVar10 = uVar10 + 1;
        dVar16 = (dVar16 * dVar16 - dVar20) + dVar15;
      }
      uVar10 = (ulong)uVar8;
LAB_00104da3:
      pCVar5 = (results_per_point->
               super__Vector_base<CalculationResult,_std::allocator<CalculationResult>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pCVar5[lVar9].iter = (int)uVar10;
      pCVar5[lVar9].distance_to_next_iteration = fVar12;
      lVar9 = lVar9 + 1;
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

void mandelbrot_calc(const ImageSize& image, const Section& section, const int max_iterations,
                     std::vector<int>& iterations_histogram, std::vector<CalculationResult>& results_per_point) noexcept
{
    const double width = section.height * (static_cast<double>(image.width) / static_cast<double>(image.height));

    const double x_left   = section.center_x - width / 2.0;
    const double x_right  = section.center_x + width / 2.0;
    const double y_top    = section.center_y + section.height / 2.0;
    const double y_bottom = section.center_y - section.height / 2.0;

    constexpr double bailout = 20.0;
    constexpr double bailout_squared = bailout * bailout;
    const double log_log_bailout = std::log(std::log(bailout));
    const double log_2 = std::log(2.0);

    double final_magnitude = 0.0;

    std::fill(iterations_histogram.begin(), iterations_histogram.end(), 0);

    int pixel = 0;

    for (int pixel_y = 0; pixel_y < image.height; ++pixel_y) {
        const double y0 = std::lerp(y_top, y_bottom, static_cast<double>(pixel_y) / static_cast<double>(image.height));

        for (int pixel_x = 0; pixel_x < image.width; ++pixel_x) {
            const double x0 = std::lerp(x_left, x_right, static_cast<double>(pixel_x) / static_cast<double>(image.width));

            double x = 0.0;
            double y = 0.0;

            // iteration, will be from 1 .. max_iterations once the loop is done
            int iter = 0;

            while (iter < max_iterations) {
                const double x_squared = x * x;
                const double y_squared = y * y;

                if (x_squared + y_squared >= bailout_squared) {
                    final_magnitude = std::sqrt(x_squared + y_squared);
                    break;
                }

                const double xtemp = x_squared - y_squared + x0;
                y = 2.0 * x * y + y0;
                x = xtemp;

                ++iter;
            }

            if (iter < max_iterations) {
                ++iterations_histogram[static_cast<std::size_t>(iter)]; // iter: 1 .. max_iterations-1, no need to count iterations_histogram[max_iterations]
                results_per_point[static_cast<std::size_t>(pixel)] = CalculationResult{iter, 1.0f - std::min(1.0f, static_cast<float>((std::log(std::log(final_magnitude)) - log_log_bailout) / log_2))};
            } else {
                results_per_point[static_cast<std::size_t>(pixel)] = CalculationResult{iter, 0.0};
            }

            ++pixel;
        }
    }
}